

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::processLine(Binasc *this,ostream *out,string *input,int lineCount)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [36];
  undefined4 local_5c;
  string local_58 [8];
  string word;
  int local_34;
  int length;
  int i;
  int status;
  int lineCount_local;
  string *input_local;
  ostream *out_local;
  Binasc *this_local;
  
  local_34 = 0;
  iVar1 = std::__cxx11::string::size();
  std::__cxx11::string::string(local_58);
  while( true ) {
    if (iVar1 <= local_34) {
      this_local._4_4_ = 1;
      goto LAB_0014bc1a;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (((*pcVar2 == ';') ||
        (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar2 == '#')) ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar2 == '/')) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (((*pcVar2 == ' ') ||
        (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar2 == '\n')) ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar2 == '\t')) {
      local_34 = local_34 + 1;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
      if (*pcVar2 == '+') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80," \n\t",&local_81);
        local_34 = getWord(this,(string *)local_58,input,(string *)local_80,local_34);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        length = processAsciiWord(this,out,(string *)local_58,lineCount);
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
        if (*pcVar2 == '\"') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b8,"\"",&local_b9);
          local_34 = getWord(this,(string *)local_58,input,(string *)local_b8,local_34);
          std::__cxx11::string::~string(local_b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          length = processStringWord(this,out,(string *)local_58,lineCount);
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
          if (*pcVar2 == 'v') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_e0," \n\t",&local_e1);
            local_34 = getWord(this,(string *)local_58,input,(string *)local_e0,local_34);
            std::__cxx11::string::~string(local_e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_e1);
            length = processVlvWord(this,out,(string *)local_58,lineCount);
          }
          else {
            pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
            if (*pcVar2 == 'p') {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_108," \n\t",&local_109);
              local_34 = getWord(this,(string *)local_58,input,(string *)local_108,local_34);
              std::__cxx11::string::~string(local_108);
              std::allocator<char>::~allocator((allocator<char> *)&local_109);
              length = processMidiPitchBendWord(this,out,(string *)local_58,lineCount);
            }
            else {
              pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
              if (*pcVar2 == 't') {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_130," \n\t",&local_131);
                local_34 = getWord(this,(string *)local_58,input,(string *)local_130,local_34);
                std::__cxx11::string::~string(local_130);
                std::allocator<char>::~allocator((allocator<char> *)&local_131);
                length = processMidiTempoWord(this,out,(string *)local_58,lineCount);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_158," \n\t",&local_159);
                local_34 = getWord(this,(string *)local_58,input,(string *)local_158,local_34);
                std::__cxx11::string::~string(local_158);
                std::allocator<char>::~allocator((allocator<char> *)&local_159);
                lVar3 = std::__cxx11::string::find((char)local_58,0x27);
                if (lVar3 == -1) {
                  lVar3 = std::__cxx11::string::find((char)local_58,0x2c);
                  if ((lVar3 == -1) && (uVar4 = std::__cxx11::string::size(), uVar4 < 3)) {
                    length = processHexWord(this,out,(string *)local_58,lineCount);
                  }
                  else {
                    length = processBinaryWord(this,out,(string *)local_58,lineCount);
                  }
                }
                else {
                  length = processDecimalWord(this,out,(string *)local_58,lineCount);
                }
              }
            }
          }
        }
      }
      if (length == 0) {
        this_local._4_4_ = 0;
LAB_0014bc1a:
        local_5c = 1;
        std::__cxx11::string::~string(local_58);
        return this_local._4_4_;
      }
    }
  }
  this_local._4_4_ = 1;
  goto LAB_0014bc1a;
}

Assistant:

int Binasc::processLine(std::ostream& out, const std::string& input,
		int lineCount) {
	int status = 1;
	int i = 0;
	int length = (int)input.size();
	std::string word;
	while (i<length) {
		if ((input[i] == ';') || (input[i] == '#') || (input[i] == '/')) {
			// comment to end of line, so ignore
			return 1;
		} else if ((input[i] == ' ') || (input[i] == '\n')
				|| (input[i] == '\t')) {
			// ignore whitespace
			i++;
			continue;
		} else if (input[i] == '+') {
			i = getWord(word, input, " \n\t", i);
			status = processAsciiWord(out, word, lineCount);
		} else if (input[i] == '"') {
			i = getWord(word, input, "\"", i);
			status = processStringWord(out, word, lineCount);
		} else if (input[i] == 'v') {
			i = getWord(word, input, " \n\t", i);
			status = processVlvWord(out, word, lineCount);
		} else if (input[i] == 'p') {
			i = getWord(word, input, " \n\t", i);
			status = processMidiPitchBendWord(out, word, lineCount);
		} else if (input[i] == 't') {
			i = getWord(word, input, " \n\t", i);
			status = processMidiTempoWord(out, word, lineCount);
		} else {
			i = getWord(word, input, " \n\t", i);
			if (word.find('\'') != std::string::npos) {
				status = processDecimalWord(out, word, lineCount);
			} else if ((word.find(',') != std::string::npos)
					|| (word.size() > 2)) {
				status = processBinaryWord(out, word, lineCount);
			} else {
				status = processHexWord(out, word, lineCount);
			}
		}

		if (status == 0) {
			return 0;
		}

	}

	return 1;
}